

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::detail::buffer<wchar_t>::append<wchar_t>(buffer<wchar_t> *this,wchar_t *begin,wchar_t *end)

{
  char *unaff_RBX;
  char *unaff_R12;
  long lVar1;
  ulong uVar2;
  
  lVar1 = (long)end - (long)begin >> 2;
  if (-1 < lVar1) {
    uVar2 = lVar1 + this->size_;
    if (this->capacity_ < uVar2) {
      (**this->_vptr_buffer)(this,uVar2);
    }
    if (end != begin) {
      memmove(this->ptr_ + this->size_,begin,(long)end - (long)begin);
    }
    this->size_ = uVar2;
    return;
  }
  assert_fail(unaff_R12,0,unaff_RBX);
}

Assistant:

void buffer<T>::append(const U* begin, const U* end) {
  size_t new_size = size_ + to_unsigned(end - begin);
  reserve(new_size);
  std::uninitialized_copy(begin, end, make_checked(ptr_, capacity_) + size_);
  size_ = new_size;
}